

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::doWalkFunction(OptimizeInstructions *this,Function *func)

{
  PassRunner *pPVar1;
  Expression **ppEVar2;
  undefined1 auStack_168 [8];
  LocalScanner scanner;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  scanner.localInfo = (vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *)&pPVar1->options;
  this->fastMath = (pPVar1->options).fastMath;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule =
       (Module *)&this->localInfo;
  auStack_168 = (undefined1  [8])0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed._M_elems[9]
  .currp = (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currFunction =
       (Function *)
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walkFunction
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)auStack_168,
             func);
  std::
  _Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                   *)&scanner.
                      super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                      .super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                      stack.fixed._M_elems[9].currp);
  Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::walk
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
              .
              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             ,&func->body);
  if (this->refinalize == true) {
    ReFinalize::ReFinalize((ReFinalize *)auStack_168);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               &scanner.
                super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                fixed._M_elems[1].currp,func,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule);
    ReFinalize::~ReFinalize((ReFinalize *)auStack_168);
  }
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule =
       (Module *)
       &((this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).super_Pass.runner)->options;
  auStack_168 = (undefined1  [8])0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currFunction =
       (Function *)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed._M_elems[9]
  .currp = (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
              *)auStack_168,
             PostWalker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
             ::scan,&func->body);
  while( true ) {
    if (((long)scanner.
               super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
               super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
               flexible.
               super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)scanner.
               super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
               super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
               fixed._M_elems[9].currp >> 4) +
        (long)scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
              .super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep
        == 0) {
      scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
      super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
      ::~Walker((Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
                 *)auStack_168);
      EHUtils::handleBlockNestedPops
                (func,(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .currModule);
      return;
    }
    if ((pointer)scanner.
                 super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                 super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                 fixed._M_elems[9].currp ==
        scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
        super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep ==
          (Expression **)0x0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                      ,0x5a,
                      "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, N = 10]"
                     );
      }
      ppEVar2 = scanner.
                super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                fixed._M_elems
                [(long)scanner.
                       super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                       .super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                       replacep + -2].currp;
      auStack_168 = (undefined1  [8])
                    scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .fixed._M_elems
                    [(long)scanner.
                           super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                           .
                           super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                           .replacep + -1].func;
      scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
      super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
           (Expression **)
           ((long)scanner.
                  super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                  replacep + -1);
    }
    else {
      ppEVar2 = (Expression **)
                scanner.
                super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                flexible.
                super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_168 = (undefined1  [8])
                    scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .flexible.
                    super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
      super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
           super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible
           .
           super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_168 == (Expression *)0x0) break;
    (*(code *)ppEVar2)((LocalScanner *)auStack_168,(Expression **)auStack_168);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x139,
                "void wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::FinalOptimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>]"
               );
}

Assistant:

void doWalkFunction(Function* func) {
    fastMath = getPassOptions().fastMath;

    // First, scan locals.
    {
      LocalScanner scanner(localInfo, getPassOptions());
      scanner.setModule(getModule());
      scanner.walkFunction(func);
    }

    // Main walk.
    super::doWalkFunction(func);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, getModule());
    }

    // Final optimizations.
    {
      FinalOptimizer optimizer(getPassOptions());
      optimizer.walkFunction(func);
    }

    // Some patterns create blocks that can interfere 'catch' and 'pop', nesting
    // the 'pop' into a block making it invalid.
    EHUtils::handleBlockNestedPops(func, *getModule());
  }